

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plg.cpp
# Opt level: O0

int32 __thiscall
rw::PluginList::registerStream
          (PluginList *this,uint32 id,StreamRead read,StreamWrite write,StreamGetSize getSize)

{
  Plugin *pPVar1;
  Plugin *pPVar2;
  Plugin *p;
  LLLink *lnk;
  LLLink *_next;
  StreamGetSize getSize_local;
  StreamWrite write_local;
  StreamRead read_local;
  uint32 id_local;
  PluginList *this_local;
  
  pPVar1 = (Plugin *)(this->plugins).link.next;
  do {
    p = pPVar1;
    pPVar1 = *(Plugin **)p;
    pPVar2 = (Plugin *)LinkList::end(&this->plugins);
    if (p == pPVar2) {
      return -1;
    }
  } while (*(uint32 *)&p[-1].read != id);
  p[-1].alwaysCallback = (AlwaysCallback)read;
  p[-1].parentList = (PluginList *)write;
  p[-1].inParentList.next = (LLLink *)getSize;
  return *(int32 *)&p[-1].copy;
}

Assistant:

int32
PluginList::registerStream(uint32 id,
	StreamRead read, StreamWrite write, StreamGetSize getSize)
{
	FORLIST(lnk, this->plugins){
		Plugin *p = PLG(lnk);
		if(p->id == id){
			p->read = read;
			p->write = write;
			p->getSize = getSize;
			return p->offset;
		}
	}
	return -1;
}